

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O3

int Saig_ManCexFirstFlopPi(Aig_Man_t *p,Aig_Man_t *pAbs)

{
  Vec_Int_t *pVVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  pVVar1 = pAbs->vCiNumsOrig;
  if (pVVar1 == (Vec_Int_t *)0x0) {
    __assert_fail("pAbs->vCiNumsOrig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldRef.c"
                  ,0x8a,"int Saig_ManCexFirstFlopPi(Aig_Man_t *, Aig_Man_t *)");
  }
  uVar2 = (ulong)p->vCis->nSize;
  if (0 < (long)uVar2) {
    uVar3 = 0;
    uVar4 = (ulong)(uint)pVVar1->nSize;
    if (pVVar1->nSize < 1) {
      uVar4 = uVar3;
    }
    do {
      if (uVar4 == uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->nTruePis <= pVVar1->pArray[uVar3]) {
        return (int)uVar3;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return -1;
}

Assistant:

int Saig_ManCexFirstFlopPi( Aig_Man_t * p, Aig_Man_t * pAbs )
{ 
    Aig_Obj_t * pObj;
    int i;
    assert( pAbs->vCiNumsOrig != NULL );
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( Vec_IntEntry(pAbs->vCiNumsOrig, i) >= Saig_ManPiNum(p) )
            return i;
    }
    return -1;
}